

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGLCoverageTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GLCoverageExtensionSpecificEnumsAreRecognizedTest::iterate
          (GLCoverageExtensionSpecificEnumsAreRecognizedTest *this)

{
  bool bVar1;
  deUint32 dVar2;
  ContextInfo *this_00;
  RenderContext *pRVar3;
  GLenum extraout_var;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  TestError *pTVar6;
  float fVar7;
  GLuint local_4e8;
  GLfloat expected_float_value;
  GLint int_value;
  GLfloat float_value;
  float epsilon;
  GLboolean bool_value;
  float local_354;
  undefined1 local_350 [4];
  GLfloat float_value_1;
  uchar local_1cd [8];
  GLboolean bool_value_1;
  MessageBuilder local_1c0;
  int local_3c;
  uint local_38;
  GLint int_value_1;
  GLenum pname;
  float epsilon_1;
  uint n_pname;
  uint n_pnames;
  GLenum pnames [4];
  Functions *gl;
  GLCoverageExtensionSpecificEnumsAreRecognizedTest *this_local;
  
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (this_00,"GL_OES_texture_storage_multisample_2d_array");
  this->gl_oes_texture_storage_multisample_2d_array_supported = bVar1;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  pnames[2] = (*pRVar3->_vptr_RenderContext[3])();
  pnames[3] = extraout_var;
  _n_pname = 0x910e00008e59;
  pnames[0] = 0x910f;
  pnames[1] = 0x9110;
  epsilon_1 = 5.60519e-45;
  for (pname = 0; pname < 4; pname = pname + 1) {
    int_value_1 = 0x3727c5ac;
    local_38 = (&n_pname)[pname];
    local_3c = -1;
    (**(code **)(pnames._8_8_ + 0x868))(local_38,&local_3c);
    dVar2 = (**(code **)(pnames._8_8_ + 0x800))();
    glu::checkError(dVar2,"glGetIntegerv() reported an error for a valid pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                    ,0x6b);
    if (local_3c < 1) {
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1c0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_1c0,(char (*) [26])"An invalid integer value ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3c);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [26])" was reported for pname [");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_38);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2af8aaf);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c0);
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Invalid integer value reported for pname.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                 ,0x72);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_1cd[0] = '\x01';
    (**(code **)(pnames._8_8_ + 0x798))(local_38,local_1cd);
    dVar2 = (**(code **)(pnames._8_8_ + 0x800))();
    glu::checkError(dVar2,"glGetBooleanv() reported an error for a valid pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                    ,0x79);
    if (((local_3c != 0) && (local_1cd[0] == '\0')) || ((local_3c == 0 && (local_1cd[0] != '\0'))))
    {
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_350,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_350,(char (*) [27])"An invalid boolean value [");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1cd);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x29ea7ce);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [26])" was reported for pname [");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_38);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x29ea7ce);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [48])" (integer value reported for the same property:");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3c);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a94734);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_350);
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Invalid boolean value reported for pname.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                 ,0x82);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_354 = -1.0;
    (**(code **)(pnames._8_8_ + 0x818))(local_38,&local_354);
    dVar2 = (**(code **)(pnames._8_8_ + 0x800))();
    glu::checkError(dVar2,"glGetFloatv() reported an error for a valid pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                    ,0x89);
    fVar7 = de::abs<float>(local_354 - (float)local_3c);
    if (1e-05 < fVar7) {
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&epsilon,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&epsilon,
                          (char (*) [34])"An invalid floating-point value [");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_354);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x29ea7ce);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [33])" was reported for pname        [");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_38);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x29ea7ce);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [48])" (integer value reported for the same property:");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3c);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a94734);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&epsilon);
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Invalid floating-point value reported for pname.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                 ,0x92);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  float_value._3_1_ = '\x01';
  int_value = 0x3727c5ac;
  expected_float_value = 1.0;
  local_4e8 = 1;
  (**(code **)(pnames._8_8_ + 0x798))(0x9104,(long)&float_value + 3);
  (**(code **)(pnames._8_8_ + 0x818))(0x9104,&expected_float_value);
  (**(code **)(pnames._8_8_ + 0x868))(0x9104,&local_4e8);
  dVar2 = (**(code **)(pnames._8_8_ + 0x800))();
  glu::checkError(dVar2,
                  "GL_TEXTURE_BINDING_2D_MULTISAMPLE pname was not recognized by one of the glGet*() functions"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0xa1);
  if (((float_value._3_1_ != '\0') || (fVar7 = de::abs<float>(expected_float_value), 1e-05 < fVar7))
     || (local_4e8 != 0)) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"Default GL_TEXTURE_BINDING_2D_MULTISAMPLE value is invalid",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,0xa5);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (this->gl_oes_texture_storage_multisample_2d_array_supported != '\0') {
    float_value._3_1_ = '\x01';
    expected_float_value = 1.0;
    local_4e8 = 1;
    (**(code **)(pnames._8_8_ + 0x798))(0x9105,(long)&float_value + 3);
    (**(code **)(pnames._8_8_ + 0x818))(0x9105,&expected_float_value);
    (**(code **)(pnames._8_8_ + 0x868))(0x9105,&local_4e8);
    dVar2 = (**(code **)(pnames._8_8_ + 0x800))();
    glu::checkError(dVar2,
                    "GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES pname was not recognized by one of the glGet*() functions"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                    ,0xb4);
    if (((float_value._3_1_ != '\0') ||
        (fVar7 = de::abs<float>(expected_float_value), 1e-05 < fVar7)) || (local_4e8 != 0)) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Default GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES value is invalid",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                 ,0xb8);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  (**(code **)(pnames._8_8_ + 0x6f8))(1,&this->to_id_2d_multisample);
  if (this->gl_oes_texture_storage_multisample_2d_array_supported != '\0') {
    (**(code **)(pnames._8_8_ + 0x6f8))(1,&this->to_id_2d_multisample_array);
  }
  dVar2 = (**(code **)(pnames._8_8_ + 0x800))();
  glu::checkError(dVar2,"glGenTextures() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0xc6);
  (**(code **)(pnames._8_8_ + 0xb8))(0x9100,this->to_id_2d_multisample);
  if (this->gl_oes_texture_storage_multisample_2d_array_supported != '\0') {
    (**(code **)(pnames._8_8_ + 0xb8))(0x9102,this->to_id_2d_multisample_array);
  }
  dVar2 = (**(code **)(pnames._8_8_ + 0x800))();
  glu::checkError(dVar2,"glBindTexture() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0xd0);
  float_value._3_1_ = '\0';
  expected_float_value = 0.0;
  local_4e8 = 0;
  (**(code **)(pnames._8_8_ + 0x798))(0x9104,(long)&float_value + 3);
  (**(code **)(pnames._8_8_ + 0x818))(0x9104,&expected_float_value);
  (**(code **)(pnames._8_8_ + 0x868))(0x9104,&local_4e8);
  dVar2 = (**(code **)(pnames._8_8_ + 0x800))();
  glu::checkError(dVar2,
                  "GL_TEXTURE_BINDING_2D_MULTISAMPLE pname was not recognized by one of the glGet*() functions"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0xdc);
  if (((float_value._3_1_ == '\x01') &&
      (fVar7 = de::abs<float>(expected_float_value - (float)this->to_id_2d_multisample),
      fVar7 <= 1e-05)) && (local_4e8 == this->to_id_2d_multisample)) {
    if (this->gl_oes_texture_storage_multisample_2d_array_supported != '\0') {
      float_value._3_1_ = '\0';
      expected_float_value = 0.0;
      local_4e8 = 0;
      (**(code **)(pnames._8_8_ + 0x798))(0x9105,(long)&float_value + 3);
      (**(code **)(pnames._8_8_ + 0x818))(0x9105,&expected_float_value);
      (**(code **)(pnames._8_8_ + 0x868))(0x9105,&local_4e8);
      dVar2 = (**(code **)(pnames._8_8_ + 0x800))();
      glu::checkError(dVar2,
                      "GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES pname was not recognized by one of the glGet*() functions"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                      ,0xf2);
      if (((float_value._3_1_ != '\x01') ||
          (fVar7 = de::abs<float>(expected_float_value - (float)this->to_id_2d_multisample_array),
          1e-05 < fVar7)) || (local_4e8 != this->to_id_2d_multisample_array)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES value is invalid",(char *)0x0
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                   ,0xf9);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return STOP;
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"GL_TEXTURE_BINDING_2D_MULTISAMPLE value is invalid",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
             ,0xe3);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult GLCoverageExtensionSpecificEnumsAreRecognizedTest::iterate()
{
	gl_oes_texture_storage_multisample_2d_array_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Iterate through all pnames that need to be verified */
	const glw::GLenum pnames[] = { GL_MAX_SAMPLE_MASK_WORDS, GL_MAX_COLOR_TEXTURE_SAMPLES, GL_MAX_DEPTH_TEXTURE_SAMPLES,
								   GL_MAX_INTEGER_SAMPLES };
	const unsigned int n_pnames = sizeof(pnames) / sizeof(pnames[0]);

	for (unsigned int n_pname = 0; n_pname < n_pnames; ++n_pname)
	{
		const float epsilon = (float)1e-5;
		glw::GLenum pname   = pnames[n_pname];

		/* Test glGetIntegerv() */
		glw::GLint int_value = -1;

		gl.getIntegerv(pname, &int_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() reported an error for a valid pname");

		if (int_value < 1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "An invalid integer value " << int_value
							   << " was reported for pname [" << pname << "]." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid integer value reported for pname.");
		}

		/* Test glGetBooleanv() */
		glw::GLboolean bool_value = GL_TRUE;

		gl.getBooleanv(pname, &bool_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() reported an error for a valid pname");

		if ((int_value != 0 && bool_value == GL_FALSE) || (int_value == 0 && bool_value != GL_FALSE))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "An invalid boolean value [" << bool_value << "]"
							   << " was reported for pname [" << pname << "]"
							   << " (integer value reported for the same property:" << int_value << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid boolean value reported for pname.");
		}

		/* Test glGetFloatv() */
		glw::GLfloat float_value = -1.0f;

		gl.getFloatv(pname, &float_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() reported an error for a valid pname");

		if (de::abs(float_value - float(int_value)) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "An invalid floating-point value [" << float_value << "]"
							   << " was reported for pname        [" << pname << "]"
							   << " (integer value reported for the same property:" << int_value << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid floating-point value reported for pname.");
		}
	} /* for (all pnames) */

	/* Verify default multisample texture bindings are valid */
	glw::GLboolean bool_value  = GL_TRUE;
	const float	epsilon	 = (float)1e-5;
	glw::GLfloat   float_value = 1.0f;
	glw::GLint	 int_value   = 1;

	gl.getBooleanv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &bool_value);
	gl.getFloatv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &float_value);
	gl.getIntegerv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(),
						"GL_TEXTURE_BINDING_2D_MULTISAMPLE pname was not recognized by one of the glGet*() functions");

	if (bool_value != GL_FALSE || de::abs(float_value) > epsilon || int_value != 0)
	{
		TCU_FAIL("Default GL_TEXTURE_BINDING_2D_MULTISAMPLE value is invalid");
	}

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		bool_value  = GL_TRUE;
		float_value = 1.0f;
		int_value   = 1;

		gl.getBooleanv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &bool_value);
		gl.getFloatv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &float_value);
		gl.getIntegerv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &int_value);

		GLU_EXPECT_NO_ERROR(
			gl.getError(),
			"GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES pname was not recognized by one of the glGet*() functions");

		if (bool_value != GL_FALSE || de::abs(float_value) > epsilon || int_value != 0)
		{
			TCU_FAIL("Default GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES value is invalid");
		}
	}

	/* Generate two texture objects we will later bind to multisample texture targets to
	 * verify the values reported for corresponding pnames have also changed.
	 */
	gl.genTextures(1, &to_id_2d_multisample);

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		gl.genTextures(1, &to_id_2d_multisample_array);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");

	/* Now bind the IDs to relevant texture targets */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id_2d_multisample);

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id_2d_multisample_array);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() failed");

	/* Verify new bindings are reported */
	bool_value  = GL_FALSE;
	float_value = 0.0f;
	int_value   = 0;

	gl.getBooleanv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &bool_value);
	gl.getFloatv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &float_value);
	gl.getIntegerv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(),
						"GL_TEXTURE_BINDING_2D_MULTISAMPLE pname was not recognized by one of the glGet*() functions");

	glw::GLfloat expected_float_value = float(to_id_2d_multisample);

	if (bool_value != GL_TRUE || de::abs(float_value - expected_float_value) > epsilon ||
		(glw::GLuint)int_value != to_id_2d_multisample)
	{
		TCU_FAIL("GL_TEXTURE_BINDING_2D_MULTISAMPLE value is invalid");
	}

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		bool_value  = GL_FALSE;
		float_value = 0.0f;
		int_value   = 0;

		gl.getBooleanv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &bool_value);
		gl.getFloatv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &float_value);
		gl.getIntegerv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &int_value);

		GLU_EXPECT_NO_ERROR(
			gl.getError(),
			"GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES pname was not recognized by one of the glGet*() functions");

		expected_float_value = float(to_id_2d_multisample_array);

		if (bool_value != GL_TRUE || de::abs(float_value - expected_float_value) > epsilon ||
			(glw::GLuint)int_value != to_id_2d_multisample_array)
		{
			TCU_FAIL("GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES value is invalid");
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}